

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::vertical_cross_to_cubemap(mipmapped_texture *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  image_u8 *this_00;
  mip_level *this_01;
  image_u8 *this_02;
  color_quad<unsigned_char,_int> *other;
  color_quad<unsigned_char,_int> *pcVar6;
  color_quad_u8 *c;
  uint local_e0;
  uint x;
  uint y;
  uint y_ofs;
  uint x_ofs;
  bool flipped;
  image_u8 *pDst_image;
  mip_level *pDst;
  image_u8 *pSrc_image;
  image_u8 tmp_img;
  mip_level *pSrc;
  uint face_index;
  undefined1 local_68 [4];
  pixel_format fmt;
  mipmapped_texture cubemap;
  bool alpha_is_valid;
  uint face_width;
  mipmapped_texture *this_local;
  
  bVar2 = is_vertical_cross(this);
  if (bVar2) {
    uVar3 = get_height(this);
    cubemap.m_last_error.m_pStr._4_4_ = uVar3 >> 2;
    cubemap.m_last_error.m_pStr._3_1_ = has_alpha(this);
    mipmapped_texture((mipmapped_texture *)local_68);
    uVar1 = cubemap.m_last_error.m_pStr._4_4_;
    dynamic_string::get_ptr(&this->m_name);
    init((mipmapped_texture *)local_68,(EVP_PKEY_CTX *)(ulong)uVar1);
    for (pSrc._0_4_ = 0; (uint)pSrc < 6; pSrc._0_4_ = (uint)pSrc + 1) {
      tmp_img.m_pixel_buf._8_8_ = get_level(this,0,0);
      image<crnlib::color_quad<unsigned_char,_int>_>::image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pSrc_image);
      this_00 = mip_level::get_unpacked_image
                          ((mip_level *)tmp_img.m_pixel_buf._8_8_,(image_u8 *)&pSrc_image,3);
      this_01 = get_level(this,(uint)pSrc,0);
      this_02 = mip_level::get_image(this_01);
      iVar4 = vec<2U,_int>::operator[]
                        ((vec<2U,_int> *)(g_vertical_cross_image_offsets + (ulong)(uint)pSrc * 8),0)
      ;
      iVar4 = iVar4 * cubemap.m_last_error.m_pStr._4_4_;
      iVar5 = vec<2U,_int>::operator[]
                        ((vec<2U,_int> *)(g_vertical_cross_image_offsets + (ulong)(uint)pSrc * 8),1)
      ;
      iVar5 = iVar5 * cubemap.m_last_error.m_pStr._4_4_;
      for (local_e0 = 0; local_e0 < cubemap.m_last_error.m_pStr._4_4_; local_e0 = local_e0 + 1) {
        for (c._4_4_ = 0; c._4_4_ < cubemap.m_last_error.m_pStr._4_4_; c._4_4_ = c._4_4_ + 1) {
          other = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                            (this_00,iVar4 + c._4_4_,iVar5 + local_e0);
          if ((uint)pSrc == 5) {
            pcVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                               (this_02,(cubemap.m_last_error.m_pStr._4_4_ - 1) - c._4_4_,
                                (cubemap.m_last_error.m_pStr._4_4_ - 1) - local_e0);
            color_quad<unsigned_char,_int>::operator=(pcVar6,other);
          }
          else {
            pcVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                               (this_02,c._4_4_,local_e0);
            color_quad<unsigned_char,_int>::operator=(pcVar6,other);
          }
        }
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::~image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pSrc_image);
    }
    swap(this,(mipmapped_texture *)local_68);
    this_local._7_1_ = true;
    ~mipmapped_texture((mipmapped_texture *)local_68);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::vertical_cross_to_cubemap() {
  if (!is_vertical_cross())
    return false;

  const uint face_width = get_height() / 4;

  bool alpha_is_valid = has_alpha();

  mipmapped_texture cubemap;

  pixel_format fmt = alpha_is_valid ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;

  cubemap.init(face_width, face_width, 1, 6, fmt, m_name.get_ptr(), cDefaultOrientationFlags);

  // +x -x +y -y +z -z
  //     0  1  2
  // 0     +y
  // 1  -x +z +x
  // 2     -y
  // 3     -z

  for (uint face_index = 0; face_index < 6; face_index++) {
    const mip_level* pSrc = get_level(0, 0);

    image_u8 tmp_img;
    image_u8* pSrc_image = pSrc->get_unpacked_image(tmp_img, cUnpackFlagUncook | cUnpackFlagUnflip);

    const mip_level* pDst = get_level(face_index, 0);
    image_u8* pDst_image = pDst->get_image();
    CRNLIB_ASSERT(pDst_image);

    const bool flipped = (face_index == 5);
    const uint x_ofs = g_vertical_cross_image_offsets[face_index][0] * face_width;
    const uint y_ofs = g_vertical_cross_image_offsets[face_index][1] * face_width;

    for (uint y = 0; y < face_width; y++) {
      for (uint x = 0; x < face_width; x++) {
        const color_quad_u8& c = (*pSrc_image)(x_ofs + x, y_ofs + y);

        if (!flipped)
          (*pDst_image)(x, y) = c;
        else
          (*pDst_image)(face_width - 1 - x, face_width - 1 - y) = c;
      }
    }
  }

  swap(cubemap);

  CRNLIB_ASSERT(check());

  return true;
}